

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_store(FuncState *fs,ExpDesc *var,ExpDesc *e)

{
  uint uVar1;
  BCReg BVar2;
  long lVar3;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  BCReg rc;
  BCReg ra_1;
  BCReg ra;
  BCIns ins;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  BCReg in_stack_ffffffffffffffdc;
  BCReg in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RSI[2] == 6) {
    lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x78) + (ulong)(uint)in_RSI[1] * 0x10;
    *(byte *)(lVar3 + 0xd) = *(byte *)(lVar3 + 0xd) | 1;
    expr_free((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    expr_toreg((FuncState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (ExpDesc *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4);
  }
  else {
    if (in_RSI[2] == 7) {
      lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x78) + (ulong)(uint)in_RSI[1] * 0x10;
      *(byte *)(lVar3 + 0xd) = *(byte *)(lVar3 + 0xd) | 1;
      expr_toval((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (*(uint *)(in_RDX + 8) < 3) {
        uVar1 = *in_RSI << 8 | 0x2fU | *(int *)(in_RDX + 8) << 0x10;
      }
      else if (*(int *)(in_RDX + 8) == 3) {
        in_stack_ffffffffffffffd4 = *in_RSI << 8 | 0x2d;
        BVar2 = const_str((FuncState *)
                          (CONCAT44(*in_RSI << 8,in_stack_ffffffffffffffd0) | 0x2d00000000),
                          (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        uVar1 = in_stack_ffffffffffffffd4 | BVar2 << 0x10;
      }
      else if (*(int *)(in_RDX + 8) == 4) {
        in_stack_ffffffffffffffd0 = *in_RSI << 8 | 0x2e;
        BVar2 = const_num((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          ,(ExpDesc *)(CONCAT44(in_stack_ffffffffffffffd4,*in_RSI << 8) | 0x2e));
        uVar1 = in_stack_ffffffffffffffd0 | BVar2 << 0x10;
      }
      else {
        in_stack_ffffffffffffffcc = *in_RSI << 8 | 0x2c;
        BVar2 = expr_toanyreg((FuncState *)
                              (CONCAT44(*in_RSI << 8,in_stack_ffffffffffffffc8) | 0x2c00000000),
                              (ExpDesc *)0x12ba38);
        uVar1 = in_stack_ffffffffffffffcc | BVar2 << 0x10;
      }
    }
    else if (in_RSI[2] == 8) {
      in_stack_ffffffffffffffe0 =
           expr_toanyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (ExpDesc *)0x12ba6a);
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffe0 << 8 | 0x35;
      BVar2 = const_str((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (ExpDesc *)
                        (CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffe0 << 8) | 0x35))
      ;
      uVar1 = in_stack_ffffffffffffffc8 | BVar2 << 0x10;
    }
    else {
      in_stack_ffffffffffffffdc =
           expr_toanyreg((FuncState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (ExpDesc *)0x12baac);
      uVar1 = in_RSI[1];
      if ((int)uVar1 < 0) {
        uVar1 = in_stack_ffffffffffffffdc << 8 | 0x3a | *in_RSI << 0x18 |
                (uVar1 ^ 0xffffffff) << 0x10;
      }
      else if (uVar1 < 0x100) {
        uVar1 = in_stack_ffffffffffffffdc << 8 | 0x39 | *in_RSI << 0x18 | uVar1 << 0x10;
      }
      else {
        uVar1 = in_stack_ffffffffffffffdc << 8 | 0x3b | *in_RSI << 0x18 | (uVar1 - 0x100) * 0x10000;
      }
    }
    bcemit_INS((FuncState *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    expr_free((FuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              (ExpDesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void bcemit_store(FuncState *fs, ExpDesc *var, ExpDesc *e)
{
  BCIns ins;
  if (var->k == VLOCAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_free(fs, e);
    expr_toreg(fs, e, var->u.s.info);
    return;
  } else if (var->k == VUPVAL) {
    fs->ls->vstack[var->u.s.aux].info |= VSTACK_VAR_RW;
    expr_toval(fs, e);
    if (e->k <= VKTRUE)
      ins = BCINS_AD(BC_USETP, var->u.s.info, const_pri(e));
    else if (e->k == VKSTR)
      ins = BCINS_AD(BC_USETS, var->u.s.info, const_str(fs, e));
    else if (e->k == VKNUM)
      ins = BCINS_AD(BC_USETN, var->u.s.info, const_num(fs, e));
    else
      ins = BCINS_AD(BC_USETV, var->u.s.info, expr_toanyreg(fs, e));
  } else if (var->k == VGLOBAL) {
    BCReg ra = expr_toanyreg(fs, e);
    ins = BCINS_AD(BC_GSET, ra, const_str(fs, var));
  } else {
    BCReg ra, rc;
    lua_assert(var->k == VINDEXED);
    ra = expr_toanyreg(fs, e);
    rc = var->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TSETS, ra, var->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TSETB, ra, var->u.s.info, rc-(BCMAX_C+1));
    } else {
      /* Free late alloced key reg to avoid assert on free of value reg. */
      /* This can only happen when called from expr_table(). */
      lua_assert(e->k != VNONRELOC || ra < fs->nactvar ||
		 rc < ra || (bcreg_free(fs, rc),1));
      ins = BCINS_ABC(BC_TSETV, ra, var->u.s.info, rc);
    }
  }
  bcemit_INS(fs, ins);
  expr_free(fs, e);
}